

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::anon_unknown_0::ReallyBigInputStream::Next
          (ReallyBigInputStream *this,void **data,int *size)

{
  long lVar1;
  bool bVar2;
  char *message;
  pointer pcVar3;
  AssertHelper local_60 [3];
  Message local_48;
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  int *size_local;
  void **data_local;
  ReallyBigInputStream *this_local;
  
  local_3c = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )size;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_38,"0","backup_amount_",&local_3c,&this->backup_amount_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar2) {
    testing::Message::Message(&local_48);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x60c,message);
    testing::internal::AssertHelper::operator=(local_60,&local_48);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  lVar1 = this->buffer_count_;
  this->buffer_count_ = lVar1 + 1;
  if (lVar1 == 0) {
    pcVar3 = std::unique_ptr<char[],_void_(*)(void_*)>::get(&this->buffer_);
    *data = pcVar3;
    *(undefined4 *)
     gtest_ar.message_._M_t.
     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     .
     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
     ._M_head_impl = 0x400;
    this_local._7_1_ = true;
  }
  else if (lVar1 == 1) {
    pcVar3 = std::unique_ptr<char[],_void_(*)(void_*)>::get(&this->buffer_);
    *data = pcVar3;
    *(undefined4 *)
     gtest_ar.message_._M_t.
     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     .
     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
     ._M_head_impl = 0x7fffffff;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Next(const void** data, int* size) override {
    // We only expect BackUp() to be called at the end.
    EXPECT_EQ(0, backup_amount_);

    switch (buffer_count_++) {
      case 0:
        *data = buffer_.get();
        *size = 1024;
        return true;
      case 1:
        // Return an enormously large buffer that, when combined with the 1k
        // returned already, should overflow the total_bytes_read_ counter in
        // CodedInputStream.
        *data = buffer_.get();
        *size = INT_MAX;
        return true;
      default:
        return false;
    }
  }